

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

nng_err nni_http_server_error(nni_http_server *s,nng_http *conn)

{
  nng_http_status status;
  nng_err nVar1;
  void *item;
  char *body;
  
  status = nni_http_get_status(conn);
  nni_mtx_lock(&s->errors_mtx);
  item = nni_list_first(&s->errors);
  body = (char *)0x0;
  do {
    if (item == (void *)0x0) {
LAB_0013f993:
      nVar1 = nni_http_set_error(conn,status,(char *)0x0,body);
      nni_mtx_unlock(&s->errors_mtx);
      return nVar1;
    }
    if (*(nng_http_status *)((long)item + 0x10) == status) {
      body = *(char **)((long)item + 0x18);
      goto LAB_0013f993;
    }
    item = nni_list_next(&s->errors,item);
  } while( true );
}

Assistant:

nng_err
nni_http_server_error(nni_http_server *s, nng_http *conn)
{
	http_error     *epage;
	char           *body = NULL;
	nng_http_status code = nni_http_get_status(conn);
	nng_err         rv;

	nni_mtx_lock(&s->errors_mtx);
	NNI_LIST_FOREACH (&s->errors, epage) {
		if (epage->code == code) {
			body = epage->body;
			break;
		}
	}
	rv = nni_http_set_error(conn, code, NULL, body);
	nni_mtx_unlock(&s->errors_mtx);
	return (rv);
}